

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Subscription_removeRetransmissionMessage(UA_Subscription *sub,UA_UInt32 sequenceNumber)

{
  UA_NotificationMessageEntry *pUVar1;
  UA_NotificationMessageEntry *entry_tmp;
  UA_NotificationMessageEntry *entry;
  UA_UInt32 sequenceNumber_local;
  UA_Subscription *sub_local;
  
  pUVar1 = (sub->retransmissionQueue).tqh_first;
  do {
    entry_tmp = pUVar1;
    if (entry_tmp == (UA_NotificationMessageEntry *)0x0) {
      return 0x807a0000;
    }
    pUVar1 = (entry_tmp->listEntry).tqe_next;
  } while ((entry_tmp->message).sequenceNumber != sequenceNumber);
  if ((entry_tmp->listEntry).tqe_next == (UA_NotificationMessageEntry *)0x0) {
    (sub->retransmissionQueue).tqh_last = (entry_tmp->listEntry).tqe_prev;
  }
  else {
    (((entry_tmp->listEntry).tqe_next)->listEntry).tqe_prev = (entry_tmp->listEntry).tqe_prev;
  }
  *(entry_tmp->listEntry).tqe_prev = (entry_tmp->listEntry).tqe_next;
  sub->retransmissionQueueSize = sub->retransmissionQueueSize - 1;
  UA_NotificationMessage_deleteMembers(&entry_tmp->message);
  free(entry_tmp);
  return 0;
}

Assistant:

UA_StatusCode
UA_Subscription_removeRetransmissionMessage(UA_Subscription *sub, UA_UInt32 sequenceNumber) {
    UA_NotificationMessageEntry *entry, *entry_tmp;
    TAILQ_FOREACH_SAFE(entry, &sub->retransmissionQueue, listEntry, entry_tmp) {
        if(entry->message.sequenceNumber != sequenceNumber)
            continue;
        TAILQ_REMOVE(&sub->retransmissionQueue, entry, listEntry);
        --sub->retransmissionQueueSize;
        UA_NotificationMessage_deleteMembers(&entry->message);
        UA_free(entry);
        return UA_STATUSCODE_GOOD;
    }
    return UA_STATUSCODE_BADSEQUENCENUMBERUNKNOWN;
}